

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shannon_entropy.cc
# Opt level: O3

int64_t draco::ComputeShannonEntropy
                  (uint32_t *symbols,int num_symbols,int max_value,int *out_num_unique_symbols)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int iVar3;
  double dVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  vector<int,_std::allocator<int>_> symbol_frequencies;
  allocator_type local_69;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  double local_50;
  value_type_conflict1 local_44;
  vector<int,_std::allocator<int>_> local_40;
  
  local_44 = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_40,(long)(int)(max_value + 1U),&local_44,&local_69);
  if (0 < num_symbols) {
    uVar2 = 0;
    do {
      local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[symbols[uVar2]] =
           local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[symbols[uVar2]] + 1;
      uVar2 = uVar2 + 1;
    } while ((uint)num_symbols != uVar2);
  }
  if (max_value < 0) {
    iVar3 = 0;
    local_68 = 0.0;
    uStack_60 = 0;
  }
  else {
    local_58 = (double)num_symbols;
    local_68 = 0.0;
    uStack_60 = 0;
    uVar2 = 0;
    iVar3 = 0;
    do {
      if (0 < local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar2]) {
        iVar3 = iVar3 + 1;
        local_50 = (double)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar2];
        dVar4 = log2(local_50 / local_58);
        uVar5 = local_68._8_4_;
        uVar6 = local_68._12_4_;
        local_68 = local_68 + dVar4 * local_50;
        auVar1._8_4_ = uVar5;
        auVar1._0_8_ = local_68;
        auVar1._12_4_ = uVar6;
        uStack_60 = auVar1._8_8_;
      }
      uVar2 = uVar2 + 1;
    } while (max_value + 1U != uVar2);
  }
  if (out_num_unique_symbols != (int *)0x0) {
    *out_num_unique_symbols = iVar3;
  }
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (long)-local_68;
}

Assistant:

int64_t ComputeShannonEntropy(const uint32_t *symbols, int num_symbols,
                              int max_value, int *out_num_unique_symbols) {
  // First find frequency of all unique symbols in the input array.
  int num_unique_symbols = 0;
  std::vector<int> symbol_frequencies(max_value + 1, 0);
  for (int i = 0; i < num_symbols; ++i) {
    ++symbol_frequencies[symbols[i]];
  }
  double total_bits = 0;
  double num_symbols_d = num_symbols;
  for (int i = 0; i < max_value + 1; ++i) {
    if (symbol_frequencies[i] > 0) {
      ++num_unique_symbols;
      // Compute Shannon entropy for the symbol.
      // We don't want to use std::log2 here for Android build.
      total_bits +=
          symbol_frequencies[i] *
          log2(static_cast<double>(symbol_frequencies[i]) / num_symbols_d);
    }
  }
  if (out_num_unique_symbols) {
    *out_num_unique_symbols = num_unique_symbols;
  }
  // Entropy is always negative.
  return static_cast<int64_t>(-total_bits);
}